

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void SetPixelColor(void *dstPtr,Color color,int format)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uchar a_1;
  uchar b_2;
  uchar g_2;
  uchar r_2;
  Vector4 coln_4;
  uchar a;
  uchar b_1;
  uchar g_1;
  uchar r_1;
  Vector4 coln_3;
  uchar b;
  uchar g;
  uchar r;
  Vector3 coln_2;
  uchar gray_1;
  Vector3 coln_1;
  uchar gray;
  Vector3 coln;
  int format_local;
  void *dstPtr_local;
  Color color_local;
  
  dstPtr_local._4_1_ = color.r;
  dstPtr_local._5_1_ = color.g;
  dstPtr_local._6_1_ = color.b;
  dstPtr_local._7_1_ = color.a;
  switch(format) {
  case 1:
    *(char *)dstPtr =
         (char)(int)((((float)dstPtr_local._6_1_ / 255.0) * 0.114 +
                     ((float)((uint)color & 0xff) / 255.0) * 0.299 +
                     ((float)dstPtr_local._5_1_ / 255.0) * 0.587) * 255.0);
    break;
  case 2:
    *(char *)dstPtr =
         (char)(int)((((float)dstPtr_local._6_1_ / 255.0) * 0.114 +
                     ((float)((uint)color & 0xff) / 255.0) * 0.299 +
                     ((float)dstPtr_local._5_1_ / 255.0) * 0.587) * 255.0);
    *(byte *)((long)dstPtr + 1) = dstPtr_local._7_1_;
    break;
  case 3:
    dVar1 = round((double)(((float)((uint)color & 0xff) / 255.0) * 31.0));
    dVar2 = round((double)(((float)dstPtr_local._5_1_ / 255.0) * 63.0));
    dVar3 = round((double)(((float)dstPtr_local._6_1_ / 255.0) * 31.0));
    *(ushort *)dstPtr =
         (ushort)(byte)(int)dVar1 << 0xb | (ushort)(byte)(int)dVar2 << 5 | (ushort)(byte)(int)dVar3;
    break;
  case 4:
    *(uchar *)dstPtr = dstPtr_local._4_1_;
    *(byte *)((long)dstPtr + 1) = dstPtr_local._5_1_;
    *(byte *)((long)dstPtr + 2) = dstPtr_local._6_1_;
    break;
  case 5:
    dVar1 = round((double)(((float)((uint)color & 0xff) / 255.0) * 31.0));
    dVar2 = round((double)(((float)dstPtr_local._5_1_ / 255.0) * 31.0));
    dVar3 = round((double)(((float)dstPtr_local._6_1_ / 255.0) * 31.0));
    *(ushort *)dstPtr =
         (ushort)(byte)(int)dVar1 << 0xb | (ushort)(byte)(int)dVar2 << 6 |
         (ushort)(byte)(int)dVar3 << 1 | (ushort)(0.19607843 < (float)dstPtr_local._7_1_ / 255.0);
    break;
  case 6:
    dVar1 = round((double)(((float)((uint)color & 0xff) / 255.0) * 15.0));
    dVar2 = round((double)(((float)dstPtr_local._5_1_ / 255.0) * 15.0));
    dVar3 = round((double)(((float)dstPtr_local._6_1_ / 255.0) * 15.0));
    dVar4 = round((double)(((float)dstPtr_local._7_1_ / 255.0) * 15.0));
    *(ushort *)dstPtr =
         (ushort)(byte)(int)dVar1 << 0xc | (ushort)(byte)(int)dVar2 << 8 |
         (ushort)(byte)(int)dVar3 << 4 | (ushort)(byte)(int)dVar4;
    break;
  case 7:
    *(uchar *)dstPtr = dstPtr_local._4_1_;
    *(byte *)((long)dstPtr + 1) = dstPtr_local._5_1_;
    *(byte *)((long)dstPtr + 2) = dstPtr_local._6_1_;
    *(byte *)((long)dstPtr + 3) = dstPtr_local._7_1_;
  }
  return;
}

Assistant:

void SetPixelColor(void *dstPtr, Color color, int format)
{
    switch (format)
    {
        case PIXELFORMAT_UNCOMPRESSED_GRAYSCALE:
        {
            // NOTE: Calculate grayscale equivalent color
            Vector3 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f };
            unsigned char gray = (unsigned char)((coln.x*0.299f + coln.y*0.587f + coln.z*0.114f)*255.0f);

            ((unsigned char *)dstPtr)[0] = gray;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA:
        {
            // NOTE: Calculate grayscale equivalent color
            Vector3 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f };
            unsigned char gray = (unsigned char)((coln.x*0.299f + coln.y*0.587f + coln.z*0.114f)*255.0f);

            ((unsigned char *)dstPtr)[0] = gray;
            ((unsigned char *)dstPtr)[1] = color.a;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R5G6B5:
        {
            // NOTE: Calculate R5G6B5 equivalent color
            Vector3 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f };

            unsigned char r = (unsigned char)(round(coln.x*31.0f));
            unsigned char g = (unsigned char)(round(coln.y*63.0f));
            unsigned char b = (unsigned char)(round(coln.z*31.0f));

            ((unsigned short *)dstPtr)[0] = (unsigned short)r << 11 | (unsigned short)g << 5 | (unsigned short)b;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R5G5B5A1:
        {
            // NOTE: Calculate R5G5B5A1 equivalent color
            Vector4 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f, (float)color.a/255.0f };

            unsigned char r = (unsigned char)(round(coln.x*31.0f));
            unsigned char g = (unsigned char)(round(coln.y*31.0f));
            unsigned char b = (unsigned char)(round(coln.z*31.0f));
            unsigned char a = (coln.w > ((float)PIXELFORMAT_UNCOMPRESSED_R5G5B5A1_ALPHA_THRESHOLD/255.0f))? 1 : 0;;

            ((unsigned short *)dstPtr)[0] = (unsigned short)r << 11 | (unsigned short)g << 6 | (unsigned short)b << 1 | (unsigned short)a;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R4G4B4A4:
        {
            // NOTE: Calculate R5G5B5A1 equivalent color
            Vector4 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f, (float)color.a/255.0f };

            unsigned char r = (unsigned char)(round(coln.x*15.0f));
            unsigned char g = (unsigned char)(round(coln.y*15.0f));
            unsigned char b = (unsigned char)(round(coln.z*15.0f));
            unsigned char a = (unsigned char)(round(coln.w*15.0f));

            ((unsigned short *)dstPtr)[0] = (unsigned short)r << 12 | (unsigned short)g << 8 | (unsigned short)b << 4 | (unsigned short)a;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R8G8B8:
        {
            ((unsigned char *)dstPtr)[0] = color.r;
            ((unsigned char *)dstPtr)[1] = color.g;
            ((unsigned char *)dstPtr)[2] = color.b;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R8G8B8A8:
        {
            ((unsigned char *)dstPtr)[0] = color.r;
            ((unsigned char *)dstPtr)[1] = color.g;
            ((unsigned char *)dstPtr)[2] = color.b;
            ((unsigned char *)dstPtr)[3] = color.a;

        } break;
        default: break;
    }
}